

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predefined_formatters.h
# Opt level: O0

SimpleDateFormat * __thiscall
booster::locale::impl_icu::icu_formatters_cache::date_formatter(icu_formatters_cache *this)

{
  pointer this_00;
  long lVar1;
  SimpleDateFormat *in_RDI;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> fmt;
  SimpleDateFormat *p;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>
  *in_stack_ffffffffffffffc0;
  thread_specific_ptr<icu_70::SimpleDateFormat> *in_stack_ffffffffffffffd0;
  SimpleDateFormat *local_18;
  SimpleDateFormat *local_8;
  
  local_18 = thread_specific_ptr<icu_70::SimpleDateFormat>::get
                       ((thread_specific_ptr<icu_70::SimpleDateFormat> *)0x26a9ef);
  local_8 = local_18;
  if (local_18 == (SimpleDateFormat *)0x0) {
    icu_70::DateFormat::createDateTimeInstance(DEFAULT,DEFAULT,(Locale *)(in_RDI + 0x650));
    std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
    unique_ptr<std::default_delete<icu_70::DateFormat>,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::get
                        (in_stack_ffffffffffffffc0);
    if (this_00 == (pointer)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = __dynamic_cast(this_00,&icu_70::DateFormat::typeinfo,
                             &icu_70::SimpleDateFormat::typeinfo,0);
    }
    if (lVar1 != 0) {
      local_18 = (SimpleDateFormat *)
                 std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::
                 release((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *
                         )0x26aa83);
      thread_specific_ptr<icu_70::SimpleDateFormat>::reset(in_stack_ffffffffffffffd0,in_RDI);
    }
    local_8 = local_18;
    std::unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>::~unique_ptr
              ((unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *)this_00);
  }
  return local_8;
}

Assistant:

icu::SimpleDateFormat *date_formatter() const
            {
                icu::SimpleDateFormat *p=date_formatter_.get();
                if(p)
                    return p;

                std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createDateTimeInstance(
                    icu::DateFormat::kMedium,
                    icu::DateFormat::kMedium,
                    locale_));
                
                if(dynamic_cast<icu::SimpleDateFormat *>(fmt.get())) {
                    p = static_cast<icu::SimpleDateFormat *>(fmt.release());
                    date_formatter_.reset(p);
                }
                return p;
            }